

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O3

void dec_vproc_set_img_fmt(IepImg *img,MppFrame frm)

{
  RK_U32 RVar1;
  
  img->format = 0;
  img->mem_addr = 0;
  img->uv_addr = 0;
  img->v_addr = 0;
  img->act_w = 0;
  img->act_h = 0;
  img->x_off = 0;
  img->y_off = 0;
  img->vir_w = 0;
  img->vir_h = 0;
  img->format = 0;
  RVar1 = mpp_frame_get_width(frm);
  img->act_w = (RK_U16)RVar1;
  RVar1 = mpp_frame_get_height(frm);
  img->act_h = (RK_U16)RVar1;
  RVar1 = mpp_frame_get_hor_stride(frm);
  img->vir_w = (RK_U16)RVar1;
  RVar1 = mpp_frame_get_ver_stride(frm);
  img->vir_h = (RK_U16)RVar1;
  img->format = 0x12;
  return;
}

Assistant:

static void dec_vproc_set_img_fmt(IepImg *img, MppFrame frm)
{
    memset(img, 0, sizeof(*img));
    img->act_w = mpp_frame_get_width(frm);
    img->act_h = mpp_frame_get_height(frm);
    img->vir_w = mpp_frame_get_hor_stride(frm);
    img->vir_h = mpp_frame_get_ver_stride(frm);
    img->format = IEP_FORMAT_YCbCr_420_SP;
}